

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<char>
          (options_serializer_boost_po *this,
          typed_option<std::vector<char,_std::allocator<char>_>_> *typed_option)

{
  bool bVar1;
  size_type sVar2;
  reference pcVar3;
  ostream *poVar4;
  long in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char *value;
  iterator __end0;
  iterator __begin0;
  vector<char,_std::allocator<char>_> *__range4;
  vector<char,_std::allocator<char>_> vec;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  typed_option<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff98;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  vector<char,_std::allocator<char>_> *local_30;
  vector<char,_std::allocator<char>_> local_28;
  long local_10;
  
  local_10 = in_RSI;
  typed_option<std::vector<char,_std::allocator<char>_>_>::value(in_stack_ffffffffffffff98);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_28);
  if (sVar2 != 0) {
    local_30 = &local_28;
    local_38._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff88);
    std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&local_38);
      poVar4 = std::operator<<((ostream *)(in_RDI + 1)," --");
      std::operator<<(poVar4,(string *)(local_10 + 8));
      in_stack_ffffffffffffff90 = std::operator<<((ostream *)(in_RDI + 1)," ");
      std::operator<<(in_stack_ffffffffffffff90,*pcVar3);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&local_38);
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>>& typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }